

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauNpn2.c
# Opt level: O1

Gia_Man_t * Dau_ConstructAigFromFile(char *pFileName)

{
  ulong uVar1;
  Gia_Obj_t *pGVar2;
  FILE *__stream;
  Gia_Man_t *p;
  char *pcVar3;
  Gia_Obj_t *pGVar4;
  size_t sVar5;
  int iVar6;
  uint uVar7;
  char Buffer [1000];
  undefined8 local_420;
  char local_418 [11];
  char local_40d [989];
  
  local_420 = fopen(pFileName,"rb");
  p = Gia_ManStart(1000);
  pcVar3 = (char *)malloc(0xe);
  builtin_strncpy(pcVar3,"func_enum_aig",0xe);
  p->pName = pcVar3;
  Gia_ManHashAlloc(p);
  iVar6 = 5;
  while( true ) {
    pGVar4 = Gia_ManAppendObj(p);
    uVar1 = *(ulong *)pGVar4;
    *(ulong *)pGVar4 = uVar1 | 0x9fffffff;
    *(ulong *)pGVar4 =
         uVar1 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(p->vCis->nSize & 0x1fffffff) << 0x20;
    pGVar2 = p->pObjs;
    if ((pGVar4 < pGVar2) || (pGVar2 + p->nObjs <= pGVar4)) break;
    Vec_IntPush(p->vCis,(int)((ulong)((long)pGVar4 - (long)pGVar2) >> 2) * -0x55555555);
    __stream = local_420;
    if ((pGVar4 < p->pObjs) || (p->pObjs + p->nObjs <= pGVar4)) break;
    iVar6 = iVar6 + -1;
    if (iVar6 == 0) {
      pcVar3 = fgets(local_418,1000,local_420);
      uVar7 = 0;
      if (pcVar3 != (char *)0x0) {
        do {
          sVar5 = strlen(local_418);
          if (local_418[sVar5 - 1] == '\n') {
            local_418[sVar5 - 1] = '\0';
          }
          sVar5 = strlen(local_418);
          if (local_418[sVar5 - 1] == '\r') {
            local_418[sVar5 - 1] = '\0';
          }
          sVar5 = strlen(local_40d);
          iVar6 = Dau_ParseFormulaAig_rec(p,local_40d,local_40d + sVar5);
          Gia_ManAppendCo(p,iVar6);
          uVar7 = uVar7 + 1;
          pcVar3 = fgets(local_418,1000,__stream);
        } while (pcVar3 != (char *)0x0);
      }
      printf("Finish constructing AIG for %d structures.\n",(ulong)uVar7);
      return p;
    }
  }
  __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

Gia_Man_t * Dau_ConstructAigFromFile( char * pFileName )
{
    char Buffer[1000];
    int i, nLines = 0;
    FILE * pFile = fopen( pFileName, "rb" );
    Gia_Man_t * p = Gia_ManStart( 1000 );
    p->pName = Abc_UtilStrsav( "func_enum_aig" );
    Gia_ManHashAlloc( p );
    for ( i = 0; i < 5; i++ )
        Gia_ManAppendCi( p );
    while ( fgets( Buffer, 1000, pFile ) )
    {
        if ( Buffer[strlen(Buffer)-1] == '\n' )
            Buffer[strlen(Buffer)-1] = 0;
        if ( Buffer[strlen(Buffer)-1] == '\r' )
            Buffer[strlen(Buffer)-1] = 0;
        Gia_ManAppendCo( p, Dau_ParseFormulaAig(p, Buffer + 11) );
        nLines++;
    }
    printf( "Finish constructing AIG for %d structures.\n", nLines );
    return p;
}